

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsItemPrivate::clearFocusHelper
          (QGraphicsItemPrivate *this,bool giveFocusToParent,bool hiddenByParentPanel)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  Int IVar4;
  QGraphicsItemPrivate *pQVar5;
  byte bVar6;
  byte in_DL;
  byte in_SIL;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  QGraphicsItem *p;
  QGraphicsItem *subFocusItem;
  bool in_stack_0000001a;
  bool in_stack_0000001b;
  undefined2 in_stack_0000001c;
  undefined8 in_stack_ffffffffffffffd0;
  QGraphicsItem *this_00;
  FocusReason focusReason;
  QGraphicsItem *this_01;
  undefined6 in_stack_ffffffffffffffe0;
  QGraphicsItem *rootItem;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> in_stack_fffffffffffffff0;
  QFlagsStorage<QGraphicsItem::GraphicsItemFlag> in_stack_fffffffffffffff4;
  
  focusReason = (FocusReason)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  _in_stack_0000001c = CONCAT13(giveFocusToParent,CONCAT12(hiddenByParentPanel,in_stack_0000001c));
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = in_SIL & 1;
  bVar2 = in_DL & 1;
  this_01 = (QGraphicsItem *)in_RDI[0x17]._vptr_QGraphicsItem;
  rootItem = in_RDI;
  if (((ulong)in_RDI[0x16]._vptr_QGraphicsItem & 0x800000000000) != 0) {
    while( true ) {
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&this_01->d_ptr);
      focusReason = (FocusReason)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
      if (pQVar5->focusScopeItem == (QGraphicsItem *)0x0) break;
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&this_01->d_ptr);
      this_01 = pQVar5->focusScopeItem;
    }
  }
  if (((bVar6 & 1) != 0) && (((ulong)in_RDI[0x16]._vptr_QGraphicsItem >> 0x37 & 1) == 0)) {
    this_00 = (QGraphicsItem *)in_RDI[9]._vptr_QGraphicsItem;
    while (this_00 != (QGraphicsItem *)0x0) {
      in_stack_fffffffffffffff0.i = (Int)QGraphicsItem::flags(this_00);
      in_stack_fffffffffffffff4.i =
           (Int)QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                          ((QFlags<QGraphicsItem::GraphicsItemFlag> *)this_00,
                           (GraphicsItemFlag)((ulong)in_RDI >> 0x20));
      IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xfffffffffffffff4);
      if (IVar4 != 0) {
        pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                 ::operator->(&this_00->d_ptr);
        if (pQVar5->focusScopeItem == (QGraphicsItem *)in_RDI[0x17]._vptr_QGraphicsItem) {
          pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>
                   ::operator->(&this_00->d_ptr);
          pQVar5->focusScopeItem = (QGraphicsItem *)0x0;
          bVar3 = QGraphicsItem::hasFocus(this_01);
          if (!bVar3) {
            (*in_RDI->_vptr_QGraphicsItem[9])(in_RDI,0);
          }
        }
        bVar3 = QGraphicsItem::hasFocus(this_01);
        if (bVar3) {
          QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
          operator->(&this_00->d_ptr);
          setFocusHelper(this,_in_stack_0000001c,in_stack_0000001b,in_stack_0000001a);
        }
        goto LAB_0097b85b;
      }
      pQVar5 = QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::
               operator->(&this_00->d_ptr);
      this_00 = pQVar5->parent;
    }
    focusReason = MouseFocusReason;
  }
  bVar3 = QGraphicsItem::hasFocus(this_01);
  if (bVar3) {
    if ((bVar2 & 1) == 0) {
      clearSubFocus((QGraphicsItemPrivate *)
                    CONCAT44(in_stack_fffffffffffffff4.i,in_stack_fffffffffffffff0.i),rootItem,
                    (QGraphicsItem *)CONCAT17(bVar6,CONCAT16(bVar2,in_stack_ffffffffffffffe0)));
    }
    QGraphicsScene::setFocusItem
              ((QGraphicsScene *)CONCAT17(bVar6,CONCAT16(bVar2,in_stack_ffffffffffffffe0)),this_01,
               focusReason);
  }
LAB_0097b85b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::clearFocusHelper(bool giveFocusToParent, bool hiddenByParentPanel)
{
    QGraphicsItem *subFocusItem = q_ptr;
    if (flags & QGraphicsItem::ItemIsFocusScope) {
        while (subFocusItem->d_ptr->focusScopeItem)
            subFocusItem = subFocusItem->d_ptr->focusScopeItem;
    }

    if (giveFocusToParent) {
        // Pass focus to the closest parent focus scope
        if (!inDestructor) {
            QGraphicsItem *p = parent;
            while (p) {
                if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
                    if (p->d_ptr->focusScopeItem == q_ptr) {
                        p->d_ptr->focusScopeItem = nullptr;
                        if (!subFocusItem->hasFocus()) //if it has focus, focusScopeItemChange is called elsewhere
                            focusScopeItemChange(false);
                    }
                    if (subFocusItem->hasFocus())
                        p->d_ptr->setFocusHelper(Qt::OtherFocusReason, /* climb = */ false,
                                                 /* focusFromHide = */ false);
                    return;
                }
                p = p->d_ptr->parent;
            }
        }
    }

    if (subFocusItem->hasFocus()) {
        // Invisible items with focus must explicitly clear subfocus.
        if (!hiddenByParentPanel)
            clearSubFocus(q_ptr);

        // If this item has the scene's input focus, clear it.
        scene->setFocusItem(nullptr);
    }
}